

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O0

void my_numbox_draw_new(t_my_numbox *x,_glist *glist)

{
  _glist *p_Var1;
  ulong uVar2;
  undefined8 in_stack_fffffffffffffe98;
  undefined4 uVar4;
  ulong uVar3;
  char **local_148;
  char *tags [4];
  char tag_object [128];
  char tag [128];
  _glist *canvas;
  _glist *glist_local;
  t_my_numbox *x_local;
  
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  p_Var1 = glist_getcanvas(glist);
  local_148 = tags + 3;
  tags[0] = tag_object + 0x78;
  tags[1] = "label";
  tags[2] = "text";
  sprintf((char *)(tags + 3),"%lxOBJ",x);
  sprintf(tag_object + 0x78,"%lxBASE1",x);
  uVar2 = 0;
  uVar3 = CONCAT44(uVar4,2);
  pdgui_vmess((char *)0x0,"crr ii rS",p_Var1,"create","polygon",0,0,"-tags",uVar3,&local_148);
  sprintf(tag_object + 0x78,"%lxBASE2",x);
  pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","line",0,0,uVar2 & 0xffffffff00000000,
              uVar3 & 0xffffffff00000000,"-tags",2,&local_148);
  sprintf(tag_object + 0x78,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crr ii rs rS",p_Var1,"create","text",0,0,"-anchor","w","-tags",4,
              &local_148);
  sprintf(tag_object + 0x78,"%lxNUMBER",x);
  pdgui_vmess((char *)0x0,"crr ii rs rS",p_Var1,"create","text",0,0,"-anchor","w","-tags",2,
              &local_148);
  my_numbox_draw_config(x,glist);
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,6);
  return;
}

Assistant:

static void my_numbox_draw_new(t_my_numbox *x, t_glist *glist)
{
    t_canvas *canvas = glist_getcanvas(glist);
    char tag[128], tag_object[128];
    char*tags[] = {tag_object, tag, "label", "text"};
    sprintf(tag_object, "%lxOBJ", x);

    sprintf(tag, "%lxBASE1", x);
    pdgui_vmess(0, "crr ii rS", canvas, "create", "polygon",
        0, 0, "-tags", 2, tags);

    sprintf(tag, "%lxBASE2", x);
    pdgui_vmess(0, "crr iiii rS", canvas, "create", "line",
        0, 0, 0, 0, "-tags", 2, tags);

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crr ii rs rS", canvas, "create", "text",
        0, 0, "-anchor", "w", "-tags", 4, tags);

    sprintf(tag, "%lxNUMBER", x);
    pdgui_vmess(0, "crr ii rs rS", canvas, "create", "text",
        0, 0, "-anchor", "w", "-tags", 2, tags);

    my_numbox_draw_config(x, glist);
    (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_IO);
}